

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

arg_rex * arg_rexn(char *shortopts,char *longopts,char *pattern,char *datatype,int mincount,
                  int maxcount,int flags,char *glossary)

{
  TRex *exp;
  TRex *local_80;
  char *local_78;
  int local_6c;
  TRex *rex;
  char *error;
  undefined8 *puStack_50;
  int i;
  privhdr *priv;
  arg_rex *result;
  size_t nbytes;
  int maxcount_local;
  int mincount_local;
  char *datatype_local;
  char *pattern_local;
  char *longopts_local;
  char *shortopts_local;
  
  rex = (TRex *)0x0;
  nbytes._4_4_ = mincount;
  _maxcount_local = datatype;
  datatype_local = pattern;
  pattern_local = longopts;
  longopts_local = shortopts;
  if (pattern == (char *)0x0) {
    nbytes._0_4_ = maxcount;
    printf("argtable: ERROR - illegal regular expression pattern \"(NULL)\"\n");
    printf("argtable: Bad argument table.\n");
    shortopts_local = (char *)0x0;
  }
  else {
    local_6c = maxcount;
    if (maxcount < mincount) {
      local_6c = mincount;
    }
    nbytes._0_4_ = local_6c;
    result = (arg_rex *)((long)local_6c * 8 + 0x80);
    priv = (privhdr *)argtable3_xmalloc((size_t)result);
    *(undefined1 *)&priv->pattern = 2;
    *(char **)&priv->flags = longopts_local;
    priv[1].pattern = pattern_local;
    if (_maxcount_local == (char *)0x0) {
      local_78 = datatype_local;
    }
    else {
      local_78 = _maxcount_local;
    }
    *(char **)&priv[1].flags = local_78;
    priv[2].pattern = glossary;
    priv[2].flags = nbytes._4_4_;
    *(int *)&priv[2].field_0xc = (int)nbytes;
    priv[3].pattern = (char *)priv;
    *(code **)&priv[3].flags = arg_rex_resetfn;
    priv[4].pattern = (char *)arg_rex_scanfn;
    *(code **)&priv[4].flags = arg_rex_checkfn;
    priv[5].pattern = (char *)arg_rex_errorfn;
    *(privhdr **)&priv[5].flags = priv + 7;
    puStack_50 = *(undefined8 **)&priv[5].flags;
    *puStack_50 = datatype_local;
    *(int *)(puStack_50 + 1) = flags;
    *(undefined8 **)&priv[6].flags = puStack_50 + 2;
    *(undefined4 *)&priv[6].pattern = 0;
    for (error._4_4_ = 0; error._4_4_ < (int)nbytes; error._4_4_ = error._4_4_ + 1) {
      *(char **)(*(long *)&priv[6].flags + (long)error._4_4_ * 8) = "";
    }
    exp = trex_compile((char *)*puStack_50,(char **)&rex,*(int *)(puStack_50 + 1));
    if (exp == (TRex *)0x0) {
      if (rex == (TRex *)0x0) {
        local_80 = (TRex *)0x1b97a6;
      }
      else {
        local_80 = rex;
      }
      dbg_printf("argtable: %s \"%s\"\n",local_80,*puStack_50);
      dbg_printf("argtable: Bad argument table.\n");
    }
    trex_free(exp);
    shortopts_local = (char *)priv;
  }
  return (arg_rex *)shortopts_local;
}

Assistant:

struct arg_rex* arg_rexn(const char* shortopts,
                         const char* longopts,
                         const char* pattern,
                         const char* datatype,
                         int mincount,
                         int maxcount,
                         int flags,
                         const char* glossary) {
    size_t nbytes;
    struct arg_rex* result;
    struct privhdr* priv;
    int i;
    const TRexChar* error = NULL;
    TRex* rex = NULL;

    if (!pattern) {
        printf("argtable: ERROR - illegal regular expression pattern \"(NULL)\"\n");
        printf("argtable: Bad argument table.\n");
        return NULL;
    }

    /* foolproof things by ensuring maxcount is not less than mincount */
    maxcount = (maxcount < mincount) ? mincount : maxcount;

    nbytes = sizeof(struct arg_rex)      /* storage for struct arg_rex */
             + sizeof(struct privhdr)    /* storage for private arg_rex data */
             + (size_t)maxcount * sizeof(char*); /* storage for sval[maxcount] array */

    /* init the arg_hdr struct */
    result = (struct arg_rex*)xmalloc(nbytes);
    result->hdr.flag = ARG_HASVALUE;
    result->hdr.shortopts = shortopts;
    result->hdr.longopts = longopts;
    result->hdr.datatype = datatype ? datatype : pattern;
    result->hdr.glossary = glossary;
    result->hdr.mincount = mincount;
    result->hdr.maxcount = maxcount;
    result->hdr.parent = result;
    result->hdr.resetfn = (arg_resetfn*)arg_rex_resetfn;
    result->hdr.scanfn = (arg_scanfn*)arg_rex_scanfn;
    result->hdr.checkfn = (arg_checkfn*)arg_rex_checkfn;
    result->hdr.errorfn = (arg_errorfn*)arg_rex_errorfn;

    /* store the arg_rex_priv struct immediately after the arg_rex struct */
    result->hdr.priv = result + 1;
    priv = (struct privhdr*)(result->hdr.priv);
    priv->pattern = pattern;
    priv->flags = flags;

    /* store the sval[maxcount] array immediately after the arg_rex_priv struct */
    result->sval = (const char**)(priv + 1);
    result->count = 0;

    /* foolproof the string pointers by initializing them to reference empty strings */
    for (i = 0; i < maxcount; i++)
        result->sval[i] = "";

    /* here we construct and destroy a regex representation of the regular
     * expression for no other reason than to force any regex errors to be
     * trapped now rather than later. If we don't, then errors may go undetected
     * until an argument is actually parsed.
     */

    rex = trex_compile(priv->pattern, &error, priv->flags);
    if (rex == NULL) {
        ARG_LOG(("argtable: %s \"%s\"\n", error ? error : _TREXC("undefined"), priv->pattern));
        ARG_LOG(("argtable: Bad argument table.\n"));
    }

    trex_free(rex);

    ARG_TRACE(("arg_rexn() returns %p\n", result));
    return result;
}